

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O0

Value MiniScript::Intrinsics::ListType(void)

{
  bool bVar1;
  anon_union_8_3_2f476f46_for_data extraout_RDX;
  Value *in_RDI;
  Value VVar2;
  Value local_318;
  String local_308;
  undefined1 local_2f8 [32];
  String local_2d8;
  undefined1 local_2c8 [32];
  String local_2a8;
  undefined1 local_298 [32];
  String local_278;
  undefined1 local_268 [32];
  String local_248;
  undefined1 local_238 [32];
  String local_218;
  undefined1 local_208 [32];
  String local_1e8;
  undefined1 local_1d8 [32];
  String local_1b8;
  undefined1 local_1a8 [32];
  String local_188;
  undefined1 local_178 [32];
  String local_158;
  undefined1 local_148 [32];
  String local_128;
  undefined1 local_118 [32];
  String local_f8;
  undefined1 local_e8 [32];
  String local_c8;
  undefined1 local_b8 [32];
  String local_98;
  undefined1 local_88 [32];
  String local_68;
  undefined1 local_58 [56];
  ValueDict d;
  
  bVar1 = Value::IsNull((Value *)_listType);
  if (bVar1) {
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::Dictionary
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_58 + 0x30));
    Value::Value((Value *)(local_58 + 0x20),"hasIndex");
    String::String(&local_68,"hasIndex");
    Intrinsic::GetByName(&local_68);
    Intrinsic::GetFunc((Intrinsic *)local_58);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_58 + 0x30),(Value *)(local_58 + 0x20),(Value *)local_58);
    Value::~Value((Value *)local_58);
    String::~String(&local_68);
    Value::~Value((Value *)(local_58 + 0x20));
    Value::Value((Value *)(local_88 + 0x10),"indexes");
    String::String(&local_98,"indexes");
    Intrinsic::GetByName(&local_98);
    Intrinsic::GetFunc((Intrinsic *)local_88);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_58 + 0x30),(Value *)(local_88 + 0x10),(Value *)local_88);
    Value::~Value((Value *)local_88);
    String::~String(&local_98);
    Value::~Value((Value *)(local_88 + 0x10));
    Value::Value((Value *)(local_b8 + 0x10),"indexOf");
    String::String(&local_c8,"indexOf");
    Intrinsic::GetByName(&local_c8);
    Intrinsic::GetFunc((Intrinsic *)local_b8);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_58 + 0x30),(Value *)(local_b8 + 0x10),(Value *)local_b8);
    Value::~Value((Value *)local_b8);
    String::~String(&local_c8);
    Value::~Value((Value *)(local_b8 + 0x10));
    Value::Value((Value *)(local_e8 + 0x10),"insert");
    String::String(&local_f8,"insert");
    Intrinsic::GetByName(&local_f8);
    Intrinsic::GetFunc((Intrinsic *)local_e8);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_58 + 0x30),(Value *)(local_e8 + 0x10),(Value *)local_e8);
    Value::~Value((Value *)local_e8);
    String::~String(&local_f8);
    Value::~Value((Value *)(local_e8 + 0x10));
    Value::Value((Value *)(local_118 + 0x10),"join");
    String::String(&local_128,"join");
    Intrinsic::GetByName(&local_128);
    Intrinsic::GetFunc((Intrinsic *)local_118);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_58 + 0x30),(Value *)(local_118 + 0x10),(Value *)local_118);
    Value::~Value((Value *)local_118);
    String::~String(&local_128);
    Value::~Value((Value *)(local_118 + 0x10));
    Value::Value((Value *)(local_148 + 0x10),"len");
    String::String(&local_158,"len");
    Intrinsic::GetByName(&local_158);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_58 + 0x30),(Value *)(local_148 + 0x10),(Value *)local_148);
    Value::~Value((Value *)local_148);
    String::~String(&local_158);
    Value::~Value((Value *)(local_148 + 0x10));
    Value::Value((Value *)(local_178 + 0x10),"pop");
    String::String(&local_188,"pop");
    Intrinsic::GetByName(&local_188);
    Intrinsic::GetFunc((Intrinsic *)local_178);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_58 + 0x30),(Value *)(local_178 + 0x10),(Value *)local_178);
    Value::~Value((Value *)local_178);
    String::~String(&local_188);
    Value::~Value((Value *)(local_178 + 0x10));
    Value::Value((Value *)(local_1a8 + 0x10),"pull");
    String::String(&local_1b8,"pull");
    Intrinsic::GetByName(&local_1b8);
    Intrinsic::GetFunc((Intrinsic *)local_1a8);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_58 + 0x30),(Value *)(local_1a8 + 0x10),(Value *)local_1a8);
    Value::~Value((Value *)local_1a8);
    String::~String(&local_1b8);
    Value::~Value((Value *)(local_1a8 + 0x10));
    Value::Value((Value *)(local_1d8 + 0x10),"push");
    String::String(&local_1e8,"push");
    Intrinsic::GetByName(&local_1e8);
    Intrinsic::GetFunc((Intrinsic *)local_1d8);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_58 + 0x30),(Value *)(local_1d8 + 0x10),(Value *)local_1d8);
    Value::~Value((Value *)local_1d8);
    String::~String(&local_1e8);
    Value::~Value((Value *)(local_1d8 + 0x10));
    Value::Value((Value *)(local_208 + 0x10),"shuffle");
    String::String(&local_218,"shuffle");
    Intrinsic::GetByName(&local_218);
    Intrinsic::GetFunc((Intrinsic *)local_208);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_58 + 0x30),(Value *)(local_208 + 0x10),(Value *)local_208);
    Value::~Value((Value *)local_208);
    String::~String(&local_218);
    Value::~Value((Value *)(local_208 + 0x10));
    Value::Value((Value *)(local_238 + 0x10),"sort");
    String::String(&local_248,"sort");
    Intrinsic::GetByName(&local_248);
    Intrinsic::GetFunc((Intrinsic *)local_238);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_58 + 0x30),(Value *)(local_238 + 0x10),(Value *)local_238);
    Value::~Value((Value *)local_238);
    String::~String(&local_248);
    Value::~Value((Value *)(local_238 + 0x10));
    Value::Value((Value *)(local_268 + 0x10),"sum");
    String::String(&local_278,"sum");
    Intrinsic::GetByName(&local_278);
    Intrinsic::GetFunc((Intrinsic *)local_268);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_58 + 0x30),(Value *)(local_268 + 0x10),(Value *)local_268);
    Value::~Value((Value *)local_268);
    String::~String(&local_278);
    Value::~Value((Value *)(local_268 + 0x10));
    Value::Value((Value *)(local_298 + 0x10),"remove");
    String::String(&local_2a8,"remove");
    Intrinsic::GetByName(&local_2a8);
    Intrinsic::GetFunc((Intrinsic *)local_298);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_58 + 0x30),(Value *)(local_298 + 0x10),(Value *)local_298);
    Value::~Value((Value *)local_298);
    String::~String(&local_2a8);
    Value::~Value((Value *)(local_298 + 0x10));
    Value::Value((Value *)(local_2c8 + 0x10),"replace");
    String::String(&local_2d8,"replace");
    Intrinsic::GetByName(&local_2d8);
    Intrinsic::GetFunc((Intrinsic *)local_2c8);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_58 + 0x30),(Value *)(local_2c8 + 0x10),(Value *)local_2c8);
    Value::~Value((Value *)local_2c8);
    String::~String(&local_2d8);
    Value::~Value((Value *)(local_2c8 + 0x10));
    Value::Value((Value *)(local_2f8 + 0x10),"values");
    String::String(&local_308,"values");
    Intrinsic::GetByName(&local_308);
    Intrinsic::GetFunc((Intrinsic *)local_2f8);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_58 + 0x30),(Value *)(local_2f8 + 0x10),(Value *)local_2f8);
    Value::~Value((Value *)local_2f8);
    String::~String(&local_308);
    Value::~Value((Value *)(local_2f8 + 0x10));
    Value::Value(&local_318,(ValueDict *)(local_58 + 0x30));
    Value::operator=((Value *)_listType,&local_318);
    Value::~Value(&local_318);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::~Dictionary
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
               (local_58 + 0x30));
  }
  Value::Value(in_RDI,(Value *)_listType);
  VVar2.data.number = extraout_RDX.number;
  VVar2._0_8_ = in_RDI;
  return VVar2;
}

Assistant:

Value Intrinsics::ListType() {
		if (_listType.IsNull()) {
			ValueDict d;
			d.SetValue("hasIndex", Intrinsic::GetByName("hasIndex")->GetFunc());
			d.SetValue("indexes", Intrinsic::GetByName("indexes")->GetFunc());
			d.SetValue("indexOf",  Intrinsic::GetByName("indexOf")->GetFunc());
			d.SetValue("insert",  Intrinsic::GetByName("insert")->GetFunc());
			d.SetValue("join",  Intrinsic::GetByName("join")->GetFunc());
			d.SetValue("len",  Intrinsic::GetByName("len")->GetFunc());
			d.SetValue("pop",  Intrinsic::GetByName("pop")->GetFunc());
			d.SetValue("pull",  Intrinsic::GetByName("pull")->GetFunc());
			d.SetValue("push",  Intrinsic::GetByName("push")->GetFunc());
			d.SetValue("shuffle",  Intrinsic::GetByName("shuffle")->GetFunc());
			d.SetValue("sort",  Intrinsic::GetByName("sort")->GetFunc());
			d.SetValue("sum",  Intrinsic::GetByName("sum")->GetFunc());
			d.SetValue("remove",  Intrinsic::GetByName("remove")->GetFunc());
			d.SetValue("replace",  Intrinsic::GetByName("replace")->GetFunc());
			d.SetValue("values",  Intrinsic::GetByName("values")->GetFunc());
			_listType = d;
		}
		return _listType;
	}